

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O2

void __thiscall
Assimp::SpatialSort::Append
          (SpatialSort *this,aiVector3D *pPositions,uint pNumPositions,uint pElementOffset,
          bool pFinalize)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char *tempPointer;
  bool bVar5;
  Entry local_44;
  
  uVar1 = ((long)(this->mPositions).
                 super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mPositions).
                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x14;
  std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::reserve
            (&this->mPositions,(pNumPositions << !pFinalize) + uVar1);
  uVar4 = (ulong)pNumPositions;
  uVar2 = 0;
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    uVar3 = (ulong)uVar2;
    local_44.mDistance =
         operator*((aiVector3t<float> *)((long)&pPositions->x + uVar3),&this->mPlaneNormal);
    local_44.mPosition.z = *(float *)((long)&pPositions->z + uVar3);
    local_44.mPosition._0_8_ = *(undefined8 *)((long)&pPositions->x + uVar3);
    local_44.mIndex = (uint)uVar1;
    std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
    emplace_back<Assimp::SpatialSort::Entry>(&this->mPositions,&local_44);
    uVar1 = (ulong)((uint)uVar1 + 1);
    uVar2 = uVar2 + pElementOffset;
  }
  if (pFinalize) {
    Finalize(this);
  }
  return;
}

Assistant:

void SpatialSort::Append( const aiVector3D* pPositions, unsigned int pNumPositions,
    unsigned int pElementOffset,
    bool pFinalize /*= true */)
{
    // store references to all given positions along with their distance to the reference plane
    const size_t initial = mPositions.size();
    mPositions.reserve(initial + (pFinalize?pNumPositions:pNumPositions*2));
    for( unsigned int a = 0; a < pNumPositions; a++)
    {
        const char* tempPointer = reinterpret_cast<const char*> (pPositions);
        const aiVector3D* vec   = reinterpret_cast<const aiVector3D*> (tempPointer + a * pElementOffset);

        // store position by index and distance
        ai_real distance = *vec * mPlaneNormal;
        mPositions.push_back( Entry( static_cast<unsigned int>(a+initial), *vec, distance));
    }

    if (pFinalize) {
        // now sort the array ascending by distance.
        Finalize();
    }
}